

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O0

void zoh_reset(SRC_PRIVATE *psrc)

{
  long lVar1;
  long in_RDI;
  ZOH_DATA *priv;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  if (lVar1 != 0) {
    *(undefined4 *)(lVar1 + 4) = *(undefined4 *)(in_RDI + 0x14);
    *(undefined4 *)(lVar1 + 8) = 1;
    memset((void *)(lVar1 + 0x30),0,(long)*(int *)(lVar1 + 4) << 2);
  }
  return;
}

Assistant:

static void
zoh_reset (SRC_PRIVATE *psrc)
{	ZOH_DATA *priv ;

	priv = (ZOH_DATA*) psrc->private_data ;
	if (priv == NULL)
		return ;

	priv->channels = psrc->channels ;
	priv->reset = 1 ;
	memset (priv->last_value, 0, sizeof (priv->last_value [0]) * priv->channels) ;

	return ;
}